

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

void __thiscall Chainstate::InvalidChainFound(Chainstate *this,CBlockIndex *pindexNew)

{
  pointer ppCVar1;
  uint256 *puVar2;
  int iVar3;
  CBlockIndex *pCVar4;
  ChainstateManager *pCVar5;
  long in_FS_OFFSET;
  double dVar6;
  double *pdVar7;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  _Alloc_hider in_stack_ffffffffffffff68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar5 = this->m_chainman;
  if (pCVar5->m_best_invalid != (CBlockIndex *)0x0) {
    iVar3 = base_uint<256U>::CompareTo
                      (&(pindexNew->nChainWork).super_base_uint<256U>,
                       &(pCVar5->m_best_invalid->nChainWork).super_base_uint<256U>);
    pCVar5 = this->m_chainman;
    if (iVar3 < 1) goto LAB_00ae8a52;
  }
  pCVar5->m_best_invalid = pindexNew;
LAB_00ae8a52:
  if ((pCVar5->m_best_header != (CBlockIndex *)0x0) &&
     (pCVar4 = CBlockIndex::GetAncestor(pCVar5->m_best_header,pindexNew->nHeight),
     pCVar4 == pindexNew)) {
    ppCVar1 = (this->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar1 ==
        (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar4 = (CBlockIndex *)0x0;
    }
    else {
      pCVar4 = ppCVar1[-1];
    }
    this->m_chainman->m_best_header = pCVar4;
  }
  puVar2 = pindexNew->phashBlock;
  if (puVar2 != (uint256 *)0x0) {
    local_78._M_allocated_capacity = *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
    local_78._8_8_ = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
    local_68 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
    uStack_60 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
    base_blob<256u>::ToString_abi_cxx11_(&local_58,&local_78);
    dVar6 = base_uint<256U>::getdouble(&(pindexNew->nChainWork).super_base_uint<256U>);
    dVar6 = log(dVar6);
    pdVar7 = (double *)(dVar6 / 0.6931471805599453);
    FormatISO8601DateTime_abi_cxx11_((string *)&stack0xffffffffffffff68,(ulong)pindexNew->nTime);
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file._M_len = 0x57;
    logging_function._M_str = "InvalidChainFound";
    logging_function._M_len = 0x11;
    LogPrintf_<char[18],std::__cxx11::string,int,double,std::__cxx11::string>
              (logging_function,source_file,0x806,
               IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|MEMPOOLREJ|PROXY|CMPCTBLOCK|SELECTCOINS|RPC|
               WALLETDB|ZMQ|BENCH|HTTP|MEMPOOL|NET,(Level)&local_58,(char *)&pindexNew->nHeight,
               (char (*) [18])&stack0xffffffffffffff60,(string *)&stack0xffffffffffffff68,
               (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),pdVar7,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff68._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff68._M_p != &local_88) {
      operator_delete(in_stack_ffffffffffffff68._M_p,local_88._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    ppCVar1 = (this->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ppCVar1 ==
         (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
         _M_impl.super__Vector_impl_data._M_start) ||
       (pCVar4 = ppCVar1[-1], pCVar4 == (CBlockIndex *)0x0)) {
      __assert_fail("tip",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                    ,0x808,"void Chainstate::InvalidChainFound(CBlockIndex *)");
    }
    puVar2 = pCVar4->phashBlock;
    if (puVar2 != (uint256 *)0x0) {
      local_78._M_allocated_capacity =
           *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
      local_78._8_8_ = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
      local_68 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
      uStack_60 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
      base_blob<256u>::ToString_abi_cxx11_(&local_58,&local_78);
      iVar3 = (int)((ulong)((long)(this->m_chain).vChain.
                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_chain).vChain.
                                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
      dVar6 = base_uint<256U>::getdouble(&(pCVar4->nChainWork).super_base_uint<256U>);
      dVar6 = log(dVar6);
      pdVar7 = (double *)(dVar6 / 0.6931471805599453);
      FormatISO8601DateTime_abi_cxx11_((string *)&stack0xffffffffffffff68,(ulong)pCVar4->nTime);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file_00._M_len = 0x57;
      logging_function_00._M_str = "InvalidChainFound";
      logging_function_00._M_len = 0x11;
      LogPrintf_<char[18],std::__cxx11::string,int,double,std::__cxx11::string>
                (logging_function_00,source_file_00,0x80b,
                 IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|MEMPOOLREJ|PROXY|CMPCTBLOCK|SELECTCOINS|
                 ESTIMATEFEE|WALLETDB|ZMQ|MEMPOOL|TOR|NET,(Level)&local_58,&stack0xffffffffffffff5c,
                 (char (*) [18])&stack0xffffffffffffff60,(string *)&stack0xffffffffffffff68,
                 (int *)CONCAT44(iVar3,in_stack_ffffffffffffff58),pdVar7,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff68._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_ffffffffffffff68._M_p != &local_88) {
        operator_delete(in_stack_ffffffffffffff68._M_p,local_88._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      CheckForkWarningConditions(this);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  }
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h",
                0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

void Chainstate::InvalidChainFound(CBlockIndex* pindexNew)
{
    AssertLockHeld(cs_main);
    if (!m_chainman.m_best_invalid || pindexNew->nChainWork > m_chainman.m_best_invalid->nChainWork) {
        m_chainman.m_best_invalid = pindexNew;
    }
    if (m_chainman.m_best_header != nullptr && m_chainman.m_best_header->GetAncestor(pindexNew->nHeight) == pindexNew) {
        m_chainman.m_best_header = m_chain.Tip();
    }

    LogPrintf("%s: invalid block=%s  height=%d  log2_work=%f  date=%s\n", __func__,
      pindexNew->GetBlockHash().ToString(), pindexNew->nHeight,
      log(pindexNew->nChainWork.getdouble())/log(2.0), FormatISO8601DateTime(pindexNew->GetBlockTime()));
    CBlockIndex *tip = m_chain.Tip();
    assert (tip);
    LogPrintf("%s:  current best=%s  height=%d  log2_work=%f  date=%s\n", __func__,
      tip->GetBlockHash().ToString(), m_chain.Height(), log(tip->nChainWork.getdouble())/log(2.0),
      FormatISO8601DateTime(tip->GetBlockTime()));
    CheckForkWarningConditions();
}